

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

void __thiscall rsg::ConditionalStatement::~ConditionalStatement(ConditionalStatement *this)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__ConditionalStatement_00d59340;
  if (this->m_condition != (Expression *)0x0) {
    (*this->m_condition->_vptr_Expression[1])();
  }
  if (this->m_trueStatement != (Statement *)0x0) {
    (*this->m_trueStatement->_vptr_Statement[1])();
  }
  if (this->m_falseStatement != (Statement *)0x0) {
    (*this->m_falseStatement->_vptr_Statement[1])();
  }
  ValueScope::~ValueScope(&this->m_conditionalScope);
  return;
}

Assistant:

ConditionalStatement::~ConditionalStatement (void)
{
	delete m_condition;
	delete m_trueStatement;
	delete m_falseStatement;
}